

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO1Tria<double> *this,
          MatrixXd *refcoords)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  undefined1 auVar4 [16];
  size_type *psVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d0;
  size_type local_1b0;
  undefined1 local_1a8 [16];
  variable_if_dynamic<long,__1> local_198;
  XprTypeNested local_190;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 2) {
    uVar8 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,3,uVar8 * 2);
    uVar8 = uVar8 & 0xffffffff;
    local_1a8._0_8_ = &DAT_bff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                      *)&local_218,1,uVar8 * 2,(scalar_constant_op<double> *)local_1a8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,0);
    local_1b0 = local_218.field_2._M_allocated_capacity;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                *)&local_218,(assign_op<double,_double> *)&local_1f8);
    auVar4 = _DAT_0038c050;
    if (0 < local_198.m_value) {
      lVar3 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      uVar6 = local_198.m_value + 1U & 0xfffffffffffffffe;
      lVar7 = local_198.m_value + -1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9 = auVar9 ^ _DAT_0038c050;
      psVar5 = (size_type *)local_1a8._0_8_;
      auVar10 = _DAT_0038c040;
      do {
        auVar11 = auVar10 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *psVar5 = local_1b0;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          psVar5[lVar3] = local_1b0;
        }
        lVar7 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar7 + 2;
        psVar5 = psVar5 + lVar3 * 2;
        uVar6 = uVar6 - 2;
      } while (uVar6 != 0);
    }
    local_1f8._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_1f8._M_string_length = 0;
    local_218._M_string_length = 1;
    local_218._M_dataplus._M_p = (pointer)&local_1f8;
    local_218.field_2._M_allocated_capacity = uVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,1);
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Replicate<Eigen::Matrix<double,1,2,1,1,2>,_1,_1>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               (Replicate<Eigen::Matrix<double,_1,_2,_1,_1,_2>,__1,__1> *)&local_218,
               (assign_op<double,_double> *)&local_1d0);
    if (0 < local_198.m_value) {
      lVar3 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      lVar7 = 0;
      psVar5 = (size_type *)local_1a8._0_8_;
      do {
        *psVar5 = (size_type)(&local_1f8._M_dataplus)[(uint)lVar7 & 1]._M_p;
        lVar7 = lVar7 + 1;
        psVar5 = psVar5 + lVar3;
      } while (local_198.m_value != lVar7);
    }
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0x3ff0000000000000;
    local_218._M_string_length = 1;
    local_218._M_dataplus._M_p = (pointer)&local_1f8;
    local_218.field_2._M_allocated_capacity = uVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,2);
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Replicate<Eigen::Matrix<double,1,2,1,1,2>,_1,_1>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               (Replicate<Eigen::Matrix<double,_1,_2,_1,_1,_2>,__1,__1> *)&local_218,
               (assign_op<double,_double> *)&local_1d0);
    if (0 < local_198.m_value) {
      lVar3 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      lVar7 = 0;
      do {
        *(pointer *)local_1a8._0_8_ = (&local_1f8._M_dataplus)[(uint)lVar7 & 1]._M_p;
        lVar7 = lVar7 + 1;
        local_1a8._0_8_ = local_1a8._0_8_ + lVar3 * 8;
      } while (local_198.m_value != lVar7);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Reference coordinates must be 2-vectors",0x27);
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"refcoords.rows() == 2","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_218,&local_1f8,0x78,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"false","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  base::AssertionFailed(&local_218,&local_1f8,0x78,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    const size_type n_pts(refcoords.cols());

    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        3, 2 * refcoords.cols());
    result.row(0) =
        Eigen::RowVectorXd::Constant(2 * static_cast<Eigen::Index>(n_pts), -1);
    result.row(1) = Eigen::RowVector2d(1., 0.).replicate(1, n_pts);
    result.row(2) = Eigen::RowVector2d(0., 1.).replicate(1, n_pts);
    return result;
  }